

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::IsAnyMessage(Descriptor *descriptor,Options *options)

{
  bool bVar1;
  string *__lhs;
  FileDescriptor *descriptor_00;
  bool local_19;
  Options *options_local;
  Descriptor *descriptor_local;
  
  __lhs = Descriptor::name_abi_cxx11_(descriptor);
  bVar1 = std::operator==(__lhs,"Any");
  local_19 = false;
  if (bVar1) {
    descriptor_00 = Descriptor::file(descriptor);
    local_19 = IsAnyMessage(descriptor_00,options);
  }
  return local_19;
}

Assistant:

bool IsAnyMessage(const Descriptor* descriptor, const Options& options) {
  return descriptor->name() == kAnyMessageName &&
         IsAnyMessage(descriptor->file(), options);
}